

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

size_t utf8_char_copy(utf8_char_t *dst,utf8_char_t *src)

{
  byte bVar1;
  size_t __n;
  
  if ((src == (utf8_char_t *)0x0) || (bVar1 = *src, bVar1 == 0)) {
    __n = 0;
  }
  else {
    __n = *(size_t *)((long)utf8_char_length::_utf8_char_length + (ulong)(bVar1 & 0xfffffff8));
    if ((dst != (utf8_char_t *)0x0) && ((0x7f00ffffU >> (bVar1 >> 3) & 1) != 0)) {
      memcpy(dst,src,__n);
      dst[__n] = '\0';
    }
  }
  return __n;
}

Assistant:

size_t utf8_char_copy(utf8_char_t* dst, const utf8_char_t* src)
{
    size_t bytes = utf8_char_length(src);

    if (bytes && dst) {
        memcpy(dst, src, bytes);
        dst[bytes] = '\0';
    }

    return bytes;
}